

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::f_formatter<spdlog::details::null_scoped_padder>::format
          (f_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_3,
          memory_buf_t *dest)

{
  memory_buf_t *in_RCX;
  memory_buf_t *in_RDI;
  null_scoped_padder p;
  size_t field_size;
  duration<long,_std::ratio<1L,_1000000L>_> micros;
  unsigned_long in_stack_ffffffffffffffc0;
  time_point in_stack_ffffffffffffffd8;
  
  fmt_helper::time_fraction<std::chrono::duration<long,std::ratio<1l,1000000l>>>
            (in_stack_ffffffffffffffd8);
  null_scoped_padder::null_scoped_padder
            ((null_scoped_padder *)&stack0xffffffffffffffc7,6,
             (padding_info *)&(in_RDI->super_buffer<char>).size_,in_RCX);
  std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count
            ((duration<long,_std::ratio<1L,_1000000L>_> *)&stack0xffffffffffffffd8);
  fmt_helper::pad6<unsigned_long>(in_stack_ffffffffffffffc0,in_RDI);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        auto micros = fmt_helper::time_fraction<std::chrono::microseconds>(msg.time);

        const size_t field_size = 6;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad6(static_cast<size_t>(micros.count()), dest);
    }